

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

bool __thiscall
covenant::Solver<covenant::Sym>::refine
          (Solver<covenant::Sym> *this,witness_t *witness,GeneralizationMethod gen,
          bool REFINE_ONLY_FIRST)

{
  undefined1 uVar1;
  size_type sVar2;
  DFA<covenant::Sym> *__s;
  ulong uVar3;
  size_type sVar4;
  reference fa1;
  ostream *poVar5;
  undefined8 uVar6;
  byte in_CL;
  int in_EDX;
  long in_RDI;
  bool bVar7;
  optional<covenant::DFA<covenant::Sym>_> refined_fa;
  dfa_t gen_lang;
  cond_eps_gen_t gen_1;
  uint li;
  bool refined;
  eps_refine_t *r;
  dfa_t Cex;
  witness_t tmp;
  int in_stack_fffffffffffff8f8;
  int in_stack_fffffffffffff8fc;
  undefined7 in_stack_fffffffffffff900;
  undefined1 in_stack_fffffffffffff907;
  key_type *in_stack_fffffffffffff908;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff910;
  allocator *paVar8;
  undefined7 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91f;
  byte bVar9;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  DFA<covenant::Sym> *in_stack_fffffffffffff930;
  ostream *in_stack_fffffffffffff938;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff948;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff950;
  string *in_stack_fffffffffffff9a0;
  ostream *in_stack_fffffffffffff9a8;
  DFA<covenant::Sym> *in_stack_fffffffffffff9b0;
  witness_t *in_stack_fffffffffffff9b8;
  allocator *in_stack_fffffffffffff9f8;
  undefined6 in_stack_fffffffffffffa00;
  undefined1 in_stack_fffffffffffffa06;
  DFA<covenant::Sym> *in_stack_fffffffffffffa50;
  undefined5 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabd;
  byte bVar10;
  undefined1 in_stack_fffffffffffffabe;
  byte bVar11;
  allocator in_stack_fffffffffffffabf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffac0;
  cfg_digest_t *in_stack_fffffffffffffac8;
  CondEpsGen<covenant::Sym> *in_stack_fffffffffffffad0;
  allocator local_519;
  string local_518 [24];
  TermFactory *in_stack_fffffffffffffb00;
  witness_t *in_stack_fffffffffffffb08;
  allocator local_481;
  string local_480 [38];
  undefined1 local_45a;
  allocator local_459;
  string local_458 [152];
  string local_3c0 [39];
  allocator local_399;
  string local_398 [32];
  string local_378 [32];
  undefined1 local_358 [112];
  int local_2e8;
  byte local_2e3;
  byte local_2e2;
  allocator local_2e1;
  string local_2e0 [48];
  undefined1 local_2b0 [301];
  byte local_183;
  byte local_182;
  allocator local_181;
  string local_180 [32];
  reference local_160;
  uint local_150;
  byte local_149;
  DFA<covenant::Sym> *local_148;
  allocator local_139;
  string local_138 [200];
  string local_70 [35];
  byte local_4d;
  byte local_3a;
  allocator local_39;
  string local_38 [35];
  byte local_15;
  int local_14;
  
  local_15 = in_CL & 1;
  local_3a = 0;
  local_4d = 0;
  bVar7 = false;
  local_14 = in_EDX;
  if ((avy::AvyLogFlag & 1) != 0) {
    std::allocator<char>::allocator();
    local_3a = 1;
    std::__cxx11::string::string(local_38,"solver",&local_39);
    local_4d = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
    bVar7 = sVar2 != 0;
  }
  if ((local_4d & 1) != 0) {
    std::__cxx11::string::~string(local_38);
  }
  if ((local_3a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if (bVar7) {
    std::operator<<((ostream *)&std::cout,"Solution found: ");
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)
               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
               (shared_ptr<covenant::TerminalFactory> *)
               CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    witness_impl::to_string_abi_cxx11_(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
    poVar5 = std::operator<<((ostream *)&std::cout,local_70);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string(local_70);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x21a8cb);
  }
  if ((*(byte *)(in_RDI + 0xe4) & 1) != 0) {
    std::vector<int,_std::allocator<int>_>::vector
              (in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)
               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
               (shared_ptr<covenant::TerminalFactory> *)
               CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
    witness_impl::to_automata<covenant::Sym>
              (in_stack_fffffffffffff9b8,&in_stack_fffffffffffff9b0->_tfac);
    boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
              ((shared_ptr<covenant::TerminalFactory> *)0x21aa00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Cex ",&local_139);
    DFA<covenant::Sym>::print_dot
              (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
    DFA<covenant::Sym>::~DFA
              ((DFA<covenant::Sym> *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff910);
  }
  local_148 = (DFA<covenant::Sym> *)0x0;
  if (local_14 == 1) {
    in_stack_fffffffffffffa50 = (DFA<covenant::Sym> *)operator_new(0x10);
    MaxEpsRefine<covenant::Sym>::MaxEpsRefine
              ((MaxEpsRefine<covenant::Sym> *)
               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
               in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8);
    local_148 = in_stack_fffffffffffffa50;
  }
  else {
    __s = (DFA<covenant::Sym> *)operator_new(8);
    memset(__s,0,8);
    GreedyEpsRefine<covenant::Sym>::GreedyEpsRefine
              ((GreedyEpsRefine<covenant::Sym> *)
               CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
    local_148 = __s;
  }
  local_149 = 0;
  for (local_150 = 0; uVar3 = (ulong)local_150,
      sVar4 = std::
              vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
              ::size((vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                      *)(in_RDI + 0x80)), uVar3 < sVar4; local_150 = local_150 + 1) {
    local_160 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffff920,
                           CONCAT17(in_stack_fffffffffffff91f,in_stack_fffffffffffff918));
    bVar7 = std::_Bit_reference::operator_cast_to_bool(&local_160);
    if (bVar7) {
      local_182 = 0;
      local_183 = 0;
      bVar7 = false;
      if ((avy::AvyLogFlag & 1) != 0) {
        std::allocator<char>::allocator();
        local_182 = 1;
        std::__cxx11::string::string(local_180,"verbose",&local_181);
        local_183 = 1;
        sVar2 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
        bVar7 = sVar2 != 0;
      }
      if ((local_183 & 1) != 0) {
        std::__cxx11::string::~string(local_180);
      }
      if ((local_182 & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_181);
      }
      if (bVar7) {
        poVar5 = std::operator<<((ostream *)&std::cout,"Automata ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_150);
        std::operator<<(poVar5," is exact\n");
      }
    }
    else {
      fa1 = std::
            vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
            ::operator[]((vector<covenant::CFGDigest<covenant::Sym>,_std::allocator<covenant::CFGDigest<covenant::Sym>_>_>
                          *)(in_RDI + 0x80),(ulong)local_150);
      boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)
                 CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                 (shared_ptr<covenant::TerminalFactory> *)
                 CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
      CondEpsGen<covenant::Sym>::CondEpsGen
                (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 (TermFactory *)
                 CONCAT17(in_stack_fffffffffffffabf,
                          CONCAT16(in_stack_fffffffffffffabe,
                                   CONCAT15(in_stack_fffffffffffffabd,in_stack_fffffffffffffab8))));
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x21ae8a);
      uVar1 = CondEpsGen<covenant::Sym>::is_empty
                        ((CondEpsGen<covenant::Sym> *)
                         CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
      if ((bool)uVar1) {
        (*(code *)(((local_148->_tfac).px)->_bimap).pn.pi_)(local_358,local_148,local_2b0);
        DFA<covenant::Sym>::eps_elim(in_stack_fffffffffffffa50);
        if ((*(byte *)(in_RDI + 0xe4) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_398,"Generalized cex wrt CFG ",&local_399);
          boost::lexical_cast<std::__cxx11::string,unsigned_int>
                    ((uint *)CONCAT17(in_stack_fffffffffffff91f,in_stack_fffffffffffff918));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff938,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff930);
          DFA<covenant::Sym>::print_dot
                    (in_stack_fffffffffffff9b0,in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0);
          std::__cxx11::string::~string(local_378);
          std::__cxx11::string::~string(local_3c0);
          std::__cxx11::string::~string(local_398);
          std::allocator<char>::~allocator((allocator<char> *)&local_399);
        }
        std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::
        operator[]((vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                    *)(in_RDI + 0x98),(ulong)local_150);
        in_stack_fffffffffffff9b0 = (DFA<covenant::Sym> *)(in_RDI + 0x68);
        std::vector<covenant::CFG,_std::allocator<covenant::CFG>_>::operator[]
                  ((vector<covenant::CFG,_std::allocator<covenant::CFG>_> *)
                   in_stack_fffffffffffff9b0,(ulong)local_150);
        std::vector<covenant::CFG,_std::allocator<covenant::CFG>_>::operator[]
                  ((vector<covenant::CFG,_std::allocator<covenant::CFG>_> *)
                   in_stack_fffffffffffff9b0,(ulong)local_150);
        DFA<covenant::Sym>::difference
                  ((dfa_t *)fa1,
                   (dfa_t *)CONCAT17(uVar1,CONCAT16(in_stack_fffffffffffffa06,
                                                    in_stack_fffffffffffffa00)),
                   (uint)((ulong)in_stack_fffffffffffff9f8 >> 0x20),(uint)in_stack_fffffffffffff9f8)
        ;
        bVar7 = boost::optional<covenant::DFA<covenant::Sym>_>::operator!
                          ((optional<covenant::DFA<covenant::Sym>_> *)0x21b311);
        if (bVar7) {
          local_45a = 1;
          uVar6 = __cxa_allocate_exception(0x20);
          paVar8 = &local_459;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_458,"refinement did not make any progress",paVar8);
          error::error((error *)CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                       (string *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          local_45a = 0;
          __cxa_throw(uVar6,&error::typeinfo,error::~error);
        }
        boost::optional<covenant::DFA<covenant::Sym>_>::operator*
                  ((optional<covenant::DFA<covenant::Sym>_> *)0x21b415);
        std::vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>::
        operator[]((vector<covenant::DFA<covenant::Sym>,_std::allocator<covenant::DFA<covenant::Sym>_>_>
                    *)(in_RDI + 0x98),(ulong)local_150);
        DFA<covenant::Sym>::operator=
                  ((DFA<covenant::Sym> *)
                   CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                   (DFA<covenant::Sym> *)
                   CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
        bVar7 = false;
        if ((avy::AvyLogFlag & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_480,"solver",&local_481);
          sVar2 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
          bVar7 = sVar2 != 0;
          std::__cxx11::string::~string(local_480);
          std::allocator<char>::~allocator((allocator<char> *)&local_481);
        }
        if (bVar7) {
          std::operator<<((ostream *)&std::cout,"New refined regular approximation:\n");
          boost::optional<covenant::DFA<covenant::Sym>_>::operator*
                    ((optional<covenant::DFA<covenant::Sym>_> *)0x21b565);
          DFA<covenant::Sym>::DFA
                    (in_stack_fffffffffffff930,
                     (DFA<covenant::Sym> *)
                     CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
          poVar5 = covenant::operator<<
                             ((ostream *)
                              CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900),
                              (DFA<covenant::Sym> *)
                              CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8));
          std::operator<<(poVar5,"\n");
          DFA<covenant::Sym>::~DFA
                    ((DFA<covenant::Sym> *)
                     CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
        }
        local_149 = 1;
        bVar7 = false;
        if ((avy::AvyLogFlag & 1) != 0) {
          paVar8 = &local_519;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_518,"verbose",paVar8);
          sVar2 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
          bVar7 = sVar2 != 0;
          std::__cxx11::string::~string(local_518);
          std::allocator<char>::~allocator((allocator<char> *)&local_519);
        }
        if (bVar7) {
          in_stack_fffffffffffff938 = std::operator<<((ostream *)&std::cout,"Automata ");
          in_stack_fffffffffffff930 =
               (DFA<covenant::Sym> *)std::ostream::operator<<(in_stack_fffffffffffff938,local_150);
          std::operator<<((ostream *)in_stack_fffffffffffff930," refined.\n");
        }
        if ((local_15 & 1) == 0) {
          local_2e8 = 0;
        }
        else {
          local_2e8 = 4;
        }
        boost::optional<covenant::DFA<covenant::Sym>_>::~optional
                  ((optional<covenant::DFA<covenant::Sym>_> *)0x21b81c);
        DFA<covenant::Sym>::~DFA
                  ((DFA<covenant::Sym> *)
                   CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
      }
      else {
        local_2e2 = 0;
        local_2e3 = 0;
        bVar7 = false;
        if ((avy::AvyLogFlag & 1) != 0) {
          in_stack_fffffffffffff9f8 = &local_2e1;
          std::allocator<char>::allocator();
          local_2e2 = 1;
          std::__cxx11::string::string(local_2e0,"verbose",in_stack_fffffffffffff9f8);
          local_2e3 = 1;
          sVar2 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(in_stack_fffffffffffff910,in_stack_fffffffffffff908);
          bVar7 = sVar2 != 0;
        }
        in_stack_fffffffffffffa06 = bVar7;
        if ((local_2e3 & 1) != 0) {
          std::__cxx11::string::~string(local_2e0);
        }
        if ((local_2e2 & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)&local_2e1);
        }
        if (bVar7 != false) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Cex is accepted by CFG ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_150);
          std::operator<<(poVar5,"\n");
        }
        local_2e8 = 6;
      }
      CondEpsGen<covenant::Sym>::~CondEpsGen
                ((CondEpsGen<covenant::Sym> *)
                 CONCAT17(in_stack_fffffffffffff907,in_stack_fffffffffffff900));
      in_stack_fffffffffffff92c = local_2e8;
      if ((local_2e8 != 0) && (local_2e8 == 4)) break;
    }
  }
  if (local_148 != (DFA<covenant::Sym> *)0x0) {
    (*(code *)(((local_148->_tfac).px)->_bimap).px)();
  }
  bVar11 = 0;
  bVar10 = 0;
  bVar9 = false;
  if ((avy::AvyLogFlag & 1) != 0) {
    paVar8 = (allocator *)&stack0xfffffffffffffabf;
    std::allocator<char>::allocator();
    bVar11 = 1;
    std::__cxx11::string::string((string *)&stack0xfffffffffffffac0,"solver",paVar8);
    bVar10 = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)paVar8,in_stack_fffffffffffff908);
    bVar9 = sVar2 != 0;
  }
  if ((bVar10 & 1) != 0) {
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffac0);
  }
  if ((bVar11 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffabf);
  }
  if ((bVar9 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"Refinement done.\n");
    std::operator<<((ostream *)&std::cout,"===================================================\n");
  }
  return (bool)(local_149 & 1);
}

Assistant:

bool refine(witness_t& witness, 
              GeneralizationMethod gen, 
              bool REFINE_ONLY_FIRST) 
  {


    LOG("solver", 
        cout << "Solution found: ";
        cout << witness_impl::to_string(witness, tfac) << "\n");
    
    if (opts.is_dot_enabled)
    {
      witness_t tmp(witness);
      dfa_t Cex = witness_impl::to_automata<EdgeSym> (tmp, tfac);
                                                      
      Cex.print_dot(refine_log, "Cex ");
    }

   
    // Choose here the generalization method.
    eps_refine_t* r = NULL;
    if(gen == MAX_GEN)
      r = new max_eps_refine_t(alphstart, alphsz);
    else 
      r = new greedy_eps_refine_t();
    
    bool refined = false;
    for(unsigned int li = 0; li < digests.size(); li++)
    {
      // L_i is regular, so w \in L_i
      if(exact[li]) 
      {
        LOG("verbose" , cout << "Automata " << li << " is exact\n");
        continue;
      }
      
      // First, we check if the witness is in the language.
      cond_eps_gen_t gen(digests[li], witness, tfac);
      if(!gen.is_empty())
      {
        LOG("verbose", cout << "Cex is accepted by CFG " << li << "\n");
        continue;
      }
      
      // Otherwise, we refine it.
      dfa_t gen_lang(r->refine(gen));
      
// #ifndef REFINE_DIFF
//       // Haven't currently extended solvers to handle complemented
//       // languages.
//       gen_lang.eps_elim();
//       dfa_t ref_complement(complement(makeDFA(gen_lang, 
//                                                       cfgs[li].alphstart, 
//                                                       cfgs[li].alphsz)));
      
//       // We can either just add ref_complement to the set of regular
//       // languages, or intersect it with an approximation.
//       reg_langs.push_back(ref_complement);
// #else
      gen_lang.eps_elim();

      if (opts.is_dot_enabled)
      {
        gen_lang.print_dot(refine_log, 
                           string("Generalized cex wrt CFG ") + 
                           boost::lexical_cast<string> (li)) ;
      }

      boost::optional<dfa_t> refined_fa = dfa_t::difference (reg_langs[li], 
                                                             gen_lang, 
                                                             cfgs[li].alphstart, 
                                                             cfgs[li].alphsz);
      
      if (!refined_fa)
      {
        throw error ("refinement did not make any progress");
      }
      
      reg_langs[li] = *refined_fa;
 
      LOG("solver", 
            cout << "New refined regular approximation:\n" << *refined_fa << "\n");
           

//#endif
      refined = true;
      LOG("verbose", cout << "Automata " << li << " refined.\n");
      if(REFINE_ONLY_FIRST)
        break;
    }
    
    delete r;
    
    LOG("solver", 
         cout << "Refinement done.\n";
         cout << "===================================================\n");
    
    return refined;
  }